

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_set.hpp
# Opt level: O0

void Omega_h::subtract_from<int>
               (set<int,_std::less<int>,_std::allocator<int>_> *a,
               set<int,_std::less<int>,_std::allocator<int>_> *b)

{
  bool bVar1;
  _Self local_48;
  _Self local_40;
  iterator it;
  int *x;
  iterator __end0;
  iterator __begin0;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  set<int,_std::less<int>,_std::allocator<int>_> *b_local;
  set<int,_std::less<int>,_std::allocator<int>_> *a_local;
  
  __end0 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(b);
  x = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end(b);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&x), bVar1) {
    it._M_node = (_Base_ptr)std::_Rb_tree_const_iterator<int>::operator*(&__end0);
    local_40._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find(a,(key_type *)it._M_node);
    local_48._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(a);
    bVar1 = std::operator==(&local_40,&local_48);
    if (!bVar1) {
      std::set<int,std::less<int>,std::allocator<int>>::erase_abi_cxx11_
                ((set<int,std::less<int>,std::allocator<int>> *)a,(const_iterator)local_40._M_node);
    }
    std::_Rb_tree_const_iterator<int>::operator++(&__end0);
  }
  return;
}

Assistant:

void subtract_from(std::set<T>& a, std::set<T> const& b) {
  for (auto& x : b) {
    auto it = a.find(x);
    if (it == a.end()) continue;
    a.erase(it);
  }
}